

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singly_linked_list.cpp
# Opt level: O1

SinglyNodeWithRand * __thiscall si9ma::SinglyLinkedList::get_node(SinglyLinkedList *this,int index)

{
  undefined8 *puVar1;
  int iVar2;
  
  if ((-1 < index) && (index < this->size)) {
    iVar2 = index + 1;
    do {
      this = (SinglyLinkedList *)this->head;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    return (SinglyNodeWithRand *)this;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "range overflow";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

SinglyNodeWithRand* SinglyLinkedList::get_node(int index) {
        if(index < 0 || index >= size)
            throw "range overflow";

        auto *node = head;
        int tmp_idx = 0;
        while (tmp_idx++ < index)
            node = node->next;

        return node;
    }